

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O0

void __thiscall Neuron_testConnectTo_Test::TestBody(Neuron_testConnectTo_Test *this)

{
  bool bVar1;
  Connections *pCVar2;
  char *pcVar3;
  AssertHelper local_190;
  Message local_188;
  size_type local_180;
  undefined4 local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  size_type local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  Message local_128;
  size_type local_120;
  undefined4 local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  undefined1 local_f0 [8];
  Neuron n2;
  Neuron n1;
  Neuron_testConnectTo_Test *this_local;
  
  Neuron::Neuron((Neuron *)
                 &n2.m_watchFor.
                  super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,10.0,1.0,50.0);
  Neuron::Neuron((Neuron *)local_f0,10.0,1.0,50.0);
  local_114 = 0;
  pCVar2 = Neuron::connections((Neuron *)
                               &n2.m_watchFor.
                                super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_120 = std::vector<Connection,_std::allocator<Connection>_>::size(pCVar2);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            (local_110,"0",(int *)"n1.connections().size()",(unsigned_long *)&local_114,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  Neuron::connectTo((Neuron *)
                    &n2.m_watchFor.
                     super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(Neuron *)local_f0,50.0);
  local_144 = 1;
  pCVar2 = Neuron::connections((Neuron *)
                               &n2.m_watchFor.
                                super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_150 = std::vector<Connection,_std::allocator<Connection>_>::size(pCVar2);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_140,"1","n1.connections().size()",&local_144,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_174 = 0;
  pCVar2 = Neuron::connections((Neuron *)local_f0);
  local_180 = std::vector<Connection,_std::allocator<Connection>_>::size(pCVar2);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            (local_170,"0",(int *)"n2.connections().size()",(unsigned_long *)&local_174,&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  Neuron::~Neuron((Neuron *)local_f0);
  Neuron::~Neuron((Neuron *)
                  &n2.m_watchFor.
                   super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Neuron, testConnectTo)
{
    Neuron n1;
    Neuron n2;

    EXPECT_EQ(0, n1.connections().size());

    n1.connectTo(&n2, 50.0f);

    EXPECT_EQ(1, n1.connections().size());
    EXPECT_EQ(0, n2.connections().size());
}